

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

size_t __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
::ByteSizeLong(MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
               *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  size_t sVar3;
  long lVar4;
  long lVar5;
  
  uVar2 = this->_has_bits_[0];
  if ((uVar2 & 1) == 0) {
    lVar5 = 0;
  }
  else {
    iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
    sVar3 = WireFormatLite::StringSize((string *)CONCAT44(extraout_var,iVar1));
    lVar5 = (long)(int)sVar3 + 1;
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 2) == 0) {
    lVar4 = 0;
  }
  else {
    (*(this->super_MessageLite)._vptr_MessageLite[0x12])(this);
    lVar4 = 9;
  }
  return lVar4 + lVar5;
}

Assistant:

size_t ByteSizeLong() const {
    size_t size = 0;
    size += has_key() ? kTagSize + KeyTypeHandler::ByteSize(key()) : 0;
    size += has_value() ? kTagSize + ValueTypeHandler::ByteSize(value()) : 0;
    return size;
  }